

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O1

void __thiscall
BoundaryElement::particle_particle_interact
          (BoundaryElement *this,double *potential,double *potential_old,
          array<unsigned_long,_2UL> target_node_element_idxs,
          array<unsigned_long,_2UL> source_node_element_idxs)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Timers_BoundaryElement *pTVar15;
  Elements *pEVar16;
  Params *pPVar17;
  size_t sVar18;
  pointer pdVar19;
  pointer pdVar20;
  pointer pdVar21;
  pointer pdVar22;
  pointer pdVar23;
  pointer pdVar24;
  pointer pdVar25;
  double dVar26;
  double dVar27;
  rep rVar28;
  long lVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  double dVar39;
  double dVar40;
  ulong local_1f8;
  undefined1 local_1e8 [440];
  
  local_1f8 = target_node_element_idxs._M_elems[0];
  pTVar15 = this->timers_;
  rVar28 = std::chrono::_V2::steady_clock::now();
  (pTVar15->particle_particle_interact).start_time_.__d.__r = rVar28;
  if (local_1f8 < target_node_element_idxs._M_elems[1]) {
    pEVar16 = this->elements_;
    pPVar17 = this->params_;
    dVar2 = pPVar17->phys_eps_;
    dVar3 = pPVar17->phys_kappa_;
    sVar18 = (pEVar16->super_Particles).num_;
    pdVar19 = (pEVar16->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar20 = (pEVar16->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar21 = (pEVar16->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar22 = (pEVar16->nx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar23 = (pEVar16->ny_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar24 = (pEVar16->nz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar27 = pPVar17->phys_kappa2_;
    pdVar25 = (pEVar16->area_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_1e8._0_16_ = ZEXT816(0);
      if (source_node_element_idxs._M_elems[0] < source_node_element_idxs._M_elems[1]) {
        dVar4 = pdVar19[local_1f8];
        dVar5 = pdVar20[local_1f8];
        dVar6 = pdVar21[local_1f8];
        dVar7 = pdVar22[local_1f8];
        dVar8 = pdVar23[local_1f8];
        dVar9 = pdVar24[local_1f8];
        local_1e8._0_16_ = ZEXT816(0);
        lVar29 = 0;
        do {
          dVar10 = pdVar22[source_node_element_idxs._M_elems[0] + lVar29];
          dVar34 = pdVar23[source_node_element_idxs._M_elems[0] + lVar29];
          dVar11 = pdVar24[source_node_element_idxs._M_elems[0] + lVar29];
          dVar12 = pdVar25[source_node_element_idxs._M_elems[0] + lVar29];
          dVar13 = potential_old[source_node_element_idxs._M_elems[0] + lVar29];
          dVar14 = potential_old[source_node_element_idxs._M_elems[0] + sVar18 + lVar29];
          dVar30 = pdVar19[source_node_element_idxs._M_elems[0] + lVar29] - dVar4;
          dVar35 = pdVar20[source_node_element_idxs._M_elems[0] + lVar29] - dVar5;
          dVar33 = pdVar21[source_node_element_idxs._M_elems[0] + lVar29] - dVar6;
          dVar32 = dVar33 * dVar33 + dVar30 * dVar30 + dVar35 * dVar35;
          if (dVar32 < 0.0) {
            dVar32 = sqrt(dVar32);
          }
          else {
            dVar32 = SQRT(dVar32);
          }
          if (0.0 < dVar32) {
            dVar31 = dVar3 * dVar32;
            dVar26 = exp(-dVar31);
            dVar40 = (dVar31 + 1.0) * dVar26;
            auVar36._8_8_ = 0x3ff0000000000000;
            auVar36._0_8_ = dVar40;
            auVar37._8_8_ = dVar32;
            auVar37._0_8_ = dVar2;
            auVar37 = divpd(auVar36,auVar37);
            dVar38 = auVar37._8_8_;
            dVar32 = dVar38 * 0.079577471545948;
            dVar31 = dVar32 * dVar38;
            dVar39 = (dVar33 * dVar11 + dVar30 * dVar10 + dVar34 * dVar35) * dVar38;
            dVar30 = (dVar33 * dVar9 + dVar30 * dVar7 + dVar8 * dVar35) * dVar38;
            dVar34 = dVar31 * (dVar30 * -3.0 * dVar39 +
                              dVar11 * dVar9 + dVar10 * dVar7 + dVar8 * dVar34) * dVar38;
            dVar10 = (double)local_1e8._8_8_ +
                     dVar12 * (dVar13 * (dVar2 * -dVar40 + 1.0) * dVar31 * dVar39 +
                              dVar14 * (dVar32 - dVar26 * dVar32));
            local_1e8._8_4_ = SUB84(dVar10,0);
            local_1e8._0_8_ =
                 (double)local_1e8._0_8_ +
                 dVar12 * (dVar13 * ((dVar26 * dVar32 * dVar30 * -dVar27 * dVar39 + dVar34 * dVar40)
                                    - dVar34) + dVar14 * (1.0 - auVar37._0_8_) * dVar30 * dVar31);
            local_1e8._12_4_ = (int)((ulong)dVar10 >> 0x20);
          }
          lVar29 = lVar29 + 1;
        } while (source_node_element_idxs._M_elems[1] - source_node_element_idxs._M_elems[0] !=
                 lVar29);
      }
      pdVar1 = potential + local_1f8;
      *pdVar1 = (double)local_1e8._8_8_ + *pdVar1;
      pdVar1[sVar18] = (double)local_1e8._0_8_ + pdVar1[sVar18];
      local_1f8 = local_1f8 + 1;
    } while (local_1f8 != target_node_element_idxs._M_elems[1]);
  }
  pTVar15 = this->timers_;
  lVar29 = std::chrono::_V2::steady_clock::now();
  (pTVar15->particle_particle_interact).end_time_.__d.__r = lVar29;
  (pTVar15->particle_particle_interact).elapsed_time_.__r =
       (double)(lVar29 - (pTVar15->particle_particle_interact).start_time_.__d.__r) / 1000000.0 +
       (pTVar15->particle_particle_interact).elapsed_time_.__r;
  return;
}

Assistant:

void BoundaryElement::particle_particle_interact(double* __restrict potential,
                                          const double* __restrict potential_old,
                                          std::array<std::size_t, 2> target_node_element_idxs,
                                          std::array<std::size_t, 2> source_node_element_idxs)
{
    timers_.particle_particle_interact.start();

    std::size_t target_node_element_begin = target_node_element_idxs[0];
    std::size_t target_node_element_end   = target_node_element_idxs[1];

    std::size_t source_node_element_begin = source_node_element_idxs[0];
    std::size_t source_node_element_end   = source_node_element_idxs[1];
    
    double eps    = params_.phys_eps_;
    double kappa  = params_.phys_kappa_;
    double kappa2 = params_.phys_kappa2_;
    
    const double* __restrict elements_x_ptr    = elements_.x_ptr();
    const double* __restrict elements_y_ptr    = elements_.y_ptr();
    const double* __restrict elements_z_ptr    = elements_.z_ptr();
    
    const double* __restrict elements_nx_ptr   = elements_.nx_ptr();
    const double* __restrict elements_ny_ptr   = elements_.ny_ptr();
    const double* __restrict elements_nz_ptr   = elements_.nz_ptr();

    const double* __restrict elements_area_ptr = elements_.area_ptr();
    
    std::size_t num_elements = elements_.num();

#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(elements_x_ptr,  elements_y_ptr,  elements_z_ptr, \
                                      elements_nx_ptr, elements_ny_ptr, elements_nz_ptr, \
                                      elements_area_ptr, potential, potential_old)
#endif
    for (std::size_t j = target_node_element_begin; j < target_node_element_end; ++j) {
        
        double target_x = elements_x_ptr[j];
        double target_y = elements_y_ptr[j];
        double target_z = elements_z_ptr[j];
        
        double target_nx = elements_nx_ptr[j];
        double target_ny = elements_ny_ptr[j];
        double target_nz = elements_nz_ptr[j];
        
        double pot_temp_1 = 0.;
        double pot_temp_2 = 0.;

#ifdef OPENACC_ENABLED
        #pragma acc loop reduction(+:pot_temp_1,pot_temp_2)
#endif
        for (std::size_t k = source_node_element_begin; k < source_node_element_end; ++k) {
        
            double source_x = elements_x_ptr[k];
            double source_y = elements_y_ptr[k];
            double source_z = elements_z_ptr[k];
            
            double source_nx = elements_nx_ptr[k];
            double source_ny = elements_ny_ptr[k];
            double source_nz = elements_nz_ptr[k];
            double source_area = elements_area_ptr[k];
            
            double potential_old_0 = potential_old[k];
            double potential_old_1 = potential_old[k + num_elements];
            
            double dist_x = source_x - target_x;
            double dist_y = source_y - target_y;
            double dist_z = source_z - target_z;
            double r = std::sqrt(dist_x * dist_x + dist_y * dist_y + dist_z * dist_z);
            
            if (r > 0) {
                double one_over_r = 1. / r;
                double G0 = constants::ONE_OVER_4PI * one_over_r;
                double kappa_r = kappa * r;
                double exp_kappa_r = std::exp(-kappa_r);
                double Gk = exp_kappa_r * G0;
                
                double source_cos  = (source_nx * dist_x + source_ny * dist_y + source_nz * dist_z) * one_over_r;
                double target_cos = (target_nx * dist_x + target_ny * dist_y + target_nz * dist_z) * one_over_r;
                
                double tp1 = G0 * one_over_r;
                double tp2 = (1. + kappa_r) * exp_kappa_r;

                double dot_tqsq = source_nx * target_nx + source_ny * target_ny + source_nz * target_nz;
                double G3 = (dot_tqsq - 3. * target_cos * source_cos) * one_over_r * tp1;
                double G4 = tp2 * G3 - kappa2 * target_cos * source_cos * Gk;

                double L1 = source_cos  * tp1 * (1. - tp2 * eps);
                double L2 = G0 - Gk;
                double L3 = G4 - G3;
                double L4 = target_cos * tp1 * (1. - tp2 / eps);
                
                pot_temp_1 += (L1 * potential_old_0 + L2 * potential_old_1) * source_area;
                pot_temp_2 += (L3 * potential_old_0 + L4 * potential_old_1) * source_area;
            }
        }
        
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        potential[j]                += pot_temp_1;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        potential[j + num_elements] += pot_temp_2;
    }

    timers_.particle_particle_interact.stop();
}